

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

void harbor_command(harbor *h,char *msg,size_t sz,int session,uint32_t source)

{
  char cVar1;
  skynet_context *psVar2;
  long lVar3;
  undefined1 *puVar4;
  uint uVar5;
  int id_00;
  char *__src;
  size_t __n;
  ulong uVar6;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  undefined1 *local_80;
  int local_74;
  slave *local_70;
  slave *slave;
  uint local_60;
  int local_5c;
  int id;
  int fd;
  unsigned_long __vla_expr0;
  char local_48 [8];
  remote_name rn;
  int s;
  char *name;
  uint32_t source_local;
  int session_local;
  size_t sz_local;
  char *msg_local;
  harbor *h_local;
  
  __vla_expr0 = (unsigned_long)auStack_88;
  __src = msg + 2;
  source_local = (uint32_t)sz;
  rn.name._12_4_ = source_local - 2;
  local_74 = (int)*msg;
  unique0x1000038a = __src;
  if (local_74 != 0x41) {
    if (local_74 == 0x4e) {
      if ((0 < (int)rn.name._12_4_) && ((int)rn.name._12_4_ < 0x10)) {
        uStack_90 = 0x10dccb;
        memset(local_48,0,0x14);
        uStack_90 = 0x10dcdc;
        memcpy(local_48,stack0xffffffffffffffd0,(long)(int)rn.name._12_4_);
        uStack_90 = 0x10dcf2;
        rn.name._8_4_ = source;
        update_name(h,local_48,source);
        return;
      }
      uStack_90 = 0x10dcb6;
      skynet_error(h->ctx,"Invalid global name %s",__src);
      return;
    }
    if (local_74 != 0x53) {
      uStack_90 = 0x10de5b;
      skynet_error(h->ctx,"Unknown command %s",msg);
      return;
    }
  }
  _id = (ulong)(source_local - 1);
  lVar3 = -(_id + 0xf & 0xfffffffffffffff0);
  __n = (size_t)(int)rn.name._12_4_;
  local_80 = auStack_88 + lVar3;
  *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10dd2c;
  memcpy(auStack_88 + lVar3,__src,__n);
  puVar4 = local_80;
  local_80[(int)rn.name._12_4_] = 0;
  local_5c = 0;
  local_60 = 0;
  *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10dd5c;
  __isoc99_sscanf(puVar4,"%d %d",&local_5c,&local_60);
  id_00 = local_5c;
  puVar4 = local_80;
  if (((local_5c == 0) || ((int)local_60 < 1)) || (0xff < (int)local_60)) {
    psVar2 = h->ctx;
    cVar1 = *msg;
    *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10dd91;
    skynet_error(psVar2,"Invalid command %c %s",(ulong)(uint)(int)cVar1,puVar4);
  }
  else {
    local_70 = h->s + (int)local_60;
    if (local_70->fd == 0) {
      local_70->fd = local_5c;
      psVar2 = h->ctx;
      *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10ddf6;
      skynet_socket_start(psVar2,id_00);
      uVar5 = local_60;
      *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10de02;
      handshake(h,uVar5);
      uVar5 = local_60;
      if (*msg == 'S') {
        local_70->status = 1;
      }
      else {
        local_70->status = 2;
        *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10de32;
        dispatch_queue(h,uVar5);
      }
    }
    else {
      psVar2 = h->ctx;
      uVar6 = (ulong)local_60;
      *(undefined8 *)(auStack_88 + lVar3 + -8) = 0x10ddd5;
      skynet_error(psVar2,"Harbor %d alreay exist",uVar6);
    }
  }
  return;
}

Assistant:

static void
harbor_command(struct harbor * h, const char * msg, size_t sz, int session, uint32_t source) {
	const char * name = msg + 2;
	int s = (int)sz;
	s -= 2;
	switch(msg[0]) {
	case 'N' : {
		if (s <=0 || s>= GLOBALNAME_LENGTH) {
			skynet_error(h->ctx, "Invalid global name %s", name);
			return;
		}
		struct remote_name rn;
		memset(&rn, 0, sizeof(rn));
		memcpy(rn.name, name, s);
		rn.handle = source;
		update_name(h, rn.name, rn.handle);
		break;
	}
	case 'S' :
	case 'A' : {
		char buffer[s+1];
		memcpy(buffer, name, s);
		buffer[s] = 0;
		int fd=0, id=0;
		sscanf(buffer, "%d %d",&fd,&id);
		if (fd == 0 || id <= 0 || id>=REMOTE_MAX) {
			skynet_error(h->ctx, "Invalid command %c %s", msg[0], buffer);
			return;
		}
		struct slave * slave = &h->s[id];
		if (slave->fd != 0) {
			skynet_error(h->ctx, "Harbor %d alreay exist", id);
			return;
		}
		slave->fd = fd;

		skynet_socket_start(h->ctx, fd);
		handshake(h, id);
		if (msg[0] == 'S') {
			slave->status = STATUS_HANDSHAKE;
		} else {
			slave->status = STATUS_HEADER;
			dispatch_queue(h,id);
		}
		break;
	}
	default:
		skynet_error(h->ctx, "Unknown command %s", msg);
		return;
	}
}